

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags)

{
  Type *nextPropertyIndex;
  Type *pTVar1;
  Type *pTVar2;
  ushort uVar3;
  ScriptContext *pSVar4;
  RecyclerWeakReference<Js::DynamicObject> *pRVar5;
  code *pcVar6;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar7;
  PropertyRecord *pPVar8;
  bool bVar9;
  Flags FVar10;
  byte bVar11;
  unsigned_short uVar12;
  int iVar13;
  BOOL BVar14;
  uint32 uVar15;
  PropertyId PVar16;
  undefined4 *puVar17;
  BigDictionaryTypeHandler *this_00;
  JavascriptFunction *pJVar18;
  JavascriptFunction *pJVar19;
  Var pvVar20;
  byte bVar21;
  Type TVar22;
  char *message;
  char *error;
  uint lineNumber;
  JavascriptLibrary *pJVar23;
  ulong uVar24;
  Type *pTVar25;
  uint propertyKey;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar26;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_88;
  ScriptContext *local_80;
  undefined4 local_74;
  PropertyRecord *local_70;
  PropertyRecord *propertyRecord;
  JavascriptFunction *local_60;
  JavascriptLibrary *local_58;
  JavascriptFunction *local_50;
  DictionaryPropertyDescriptor<unsigned_short> *local_48;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  int i;
  uint local_34;
  
  propertyRecord._0_4_ = flags;
  local_60 = (JavascriptFunction *)getter;
  local_50 = (JavascriptFunction *)setter;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x653,"(instance)","instance");
    if (!bVar9) goto LAB_00d97b76;
    *puVar17 = 0;
  }
  pJVar23 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar4 = (pJVar23->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar9 = DynamicTypeHandler::VerifyIsExtensible(&this->super_DynamicTypeHandler,pSVar4,false);
  local_58 = pJVar23;
  if (((!bVar9) &&
      (iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x11])
                          (this,instance,(ulong)(uint)propertyId,0,0), iVar13 == 0)) &&
     (bVar9 = JavascriptFunction::IsBuiltinProperty(instance,(PropertyIds)propertyId), !bVar9)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x658,
                                "(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId))"
                                ,
                                "this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId) || JavascriptFunction::IsBuiltinProperty(instance, propertyId)"
                               );
    if (!bVar9) goto LAB_00d97b76;
    *puVar17 = 0;
    pJVar23 = local_58;
  }
  iVar13 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar13 + -2 < (int)(uint)this->nextPropertyIndex) {
    if (0xfffc < iVar13) {
      this_00 = ConvertToBigDictionaryTypeHandler(this,instance);
      BVar14 = DictionaryTypeHandlerBase<int>::SetAccessors
                         (this_00,instance,propertyId,local_60,local_50,
                          (PropertyOperationFlags)propertyRecord);
      return BVar14;
    }
    EnsureSlotCapacity(this,instance,2);
  }
  if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
    ScriptContext::InvalidateProtoCaches(pSVar4,propertyId);
  }
  if ((local_60 == (JavascriptFunction *)0x0) ||
     ((pJVar23->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == local_60)) {
    propertyRecord._4_4_ = (undefined4)CONCAT71((int7)((ulong)local_60 >> 8),1);
  }
  else {
    propertyRecord._4_4_ = 0;
  }
  if ((local_50 == (JavascriptFunction *)0x0) ||
     ((pJVar23->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == local_50)) {
    uVar24 = CONCAT71((int7)((ulong)pJVar23 >> 8),1);
  }
  else {
    uVar24 = 0;
  }
  local_80 = pSVar4;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x677,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar9) goto LAB_00d97b76;
    *puVar17 = 0;
  }
  nextPropertyIndex = &this->nextPropertyIndex;
  local_70 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar9 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_70,&local_48,(int *)&descriptor);
  pJVar23 = local_58;
  local_34 = propertyId;
  if (bVar9) {
    if (((local_48->flags & (UsedAsFixed|IsFixed)) != None) &&
       (((local_48->Attributes & 8) != 0 ||
        (((local_48->Data == 0xffff && (local_48->Getter == 0xffff)) && (local_48->Setter == 0xffff)
         ))))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x67c,"(descriptor->SanityCheckFixedBits())",
                                  "descriptor->SanityCheckFixedBits()");
      if (!bVar9) goto LAB_00d97b76;
      *puVar17 = 0;
    }
    pJVar23 = local_58;
    bVar11 = local_48->Attributes;
    if ((bVar11 & 8) != 0) {
      bVar21 = 7;
      if ((bVar11 & 0x10) != 0) {
        bVar21 = bVar11 & 0xd0 | 7;
      }
      local_48->Attributes = bVar21;
    }
    propertyKey = local_34;
    if ((local_48->flags & IsAccessor) == None) {
      local_60 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_60,local_58);
      propertyKey = local_34;
      uVar24 = uVar24 & 0xffffffff;
      local_50 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_50,pJVar23);
    }
    bVar9 = DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter
                      (local_48,nextPropertyIndex);
    if ((bVar9) &&
       ((this->super_DynamicTypeHandler).slotCapacity < (int)(uint)this->nextPropertyIndex)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x694,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar9) goto LAB_00d97b76;
      *puVar17 = 0;
      propertyKey = local_34;
    }
    if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x698,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar9) goto LAB_00d97b76;
      *puVar17 = 0;
      propertyKey = local_34;
    }
    pRVar5 = (this->singletonInstance).ptr;
    if (pRVar5 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      bVar9 = false;
    }
    else if ((DynamicObject *)(pRVar5->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar9 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x69b,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar9) goto LAB_00d97b76;
      *puVar17 = 0;
      bVar9 = false;
      propertyKey = local_34;
    }
    FVar10 = local_48->flags;
    if ((FVar10 & IsInitialized) == None) {
      local_48->flags = FVar10 | IsInitialized;
      if (bVar9 && 0xf < propertyKey) {
        BVar14 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if ((((PropertyOperationFlags)propertyRecord & PropertyOperation_NonFixedValue) ==
             PropertyOperation_None) && (BVar14 != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar17 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x6a5,
                                      "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                      ,
                                      "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                     );
          if (!bVar9) goto LAB_00d97b76;
          *puVar17 = 0;
LAB_00d978b6:
          pDVar26 = local_48;
          bVar9 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixAccessorPropsPhase);
          FVar10 = !bVar9 << 5;
        }
        else {
          if (((PropertyOperationFlags)propertyRecord & PropertyOperation_NonFixedValue) ==
              PropertyOperation_None) goto LAB_00d978b6;
          FVar10 = None;
          pDVar26 = local_48;
        }
        pDVar26->flags = pDVar26->flags & ~IsFixed | FVar10;
      }
      if ((byte)((byte)propertyRecord._4_4_ | (byte)uVar24) == 1) {
        local_48->flags = local_48->flags | IsOnlyOneAccessorInitialized;
      }
    }
    else {
      if ((FVar10 & IsOnlyOneAccessorInitialized) != None) {
        uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_48);
        pJVar18 = (JavascriptFunction *)
                  DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,(uint)uVar12)
        ;
        uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_48);
        pJVar19 = (JavascriptFunction *)
                  DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,(uint)uVar12)
        ;
        if ((((~(byte)propertyRecord._4_4_ & local_60 != pJVar18) == 0) &&
            (pJVar19 == (local_58->super_JavascriptLibraryBase).defaultAccessorFunction.ptr)) ||
           (((~(byte)uVar24 & local_50 != pJVar19) == 0 &&
            (pJVar18 == (local_58->super_JavascriptLibraryBase).defaultAccessorFunction.ptr)))) {
          local_48->flags = local_48->flags & ~IsOnlyOneAccessorInitialized;
          goto LAB_00d97982;
        }
      }
      InvalidateFixedField<int>(this,instance,propertyKey,local_48);
    }
LAB_00d97982:
    if (local_60 != (JavascriptFunction *)0x0) {
      pvVar20 = DynamicTypeHandler::CanonicalizeAccessor(local_60,local_58);
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_48);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,pvVar20);
    }
    pJVar23 = local_58;
    if (local_50 != (JavascriptFunction *)0x0) {
      pvVar20 = DynamicTypeHandler::CanonicalizeAccessor(local_50,local_58);
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_48);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,pvVar20);
    }
    DynamicObject::ChangeType(instance);
    Memory::Recycler::WBSetBit((char *)&descriptor);
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                 &pJVar23->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
    pDVar26 = descriptor;
    pPVar8 = local_70;
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    pSVar4 = local_80;
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      PVar16 = DynamicTypeHandler::TMapKey_GetPropertyId(local_80,pPVar8);
      ScriptContext::InvalidateStoreFieldCaches(pSVar4,PVar16);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pDVar26);
    }
    pTVar25 = &local_58->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&descriptor);
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)pTVar25;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
    pDVar26 = descriptor;
    bVar9 = NoSpecialPropertyCache::IsSpecialProperty(local_70);
    if ((bVar9) &&
       (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
       ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)pDVar26);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,local_34,(Var)0x0,SideEffects_Any);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(local_48);
    pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
    if (pvVar20 != (Var)0x0) {
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(local_48);
      pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
      if (pvVar20 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    error = 
    "(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr)"
    ;
    message = 
    "instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr"
    ;
    lineNumber = 0x6d5;
  }
  else {
    if (local_70->isNumeric == true) {
      uVar15 = PropertyRecord::GetNumericValue(local_70);
      iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x30])
                         (this,instance,(ulong)uVar15,local_60,local_50);
      return iVar13;
    }
    local_74 = (int)uVar24;
    local_60 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_60,local_58);
    pJVar18 = (JavascriptFunction *)DynamicTypeHandler::CanonicalizeAccessor(local_50,pJVar23);
    uVar3 = *nextPropertyIndex;
    if (uVar3 == 0xffff) {
LAB_00d97b78:
      ::Math::DefaultOverflowPolicy();
    }
    TVar22 = uVar3 + 1;
    *nextPropertyIndex = TVar22;
    local_50 = pJVar18;
    if (TVar22 == 0xffff) goto LAB_00d97b78;
    iVar13 = uVar3 + 2;
    this->nextPropertyIndex = (Type)iVar13;
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                 CONCAT26(TVar22,CONCAT24(uVar3,CONCAT22(0xffff,CONCAT11(7,descriptor._0_1_))));
    if ((this->super_DynamicTypeHandler).slotCapacity < iVar13) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e6,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar9) goto LAB_00d97b76;
      *puVar17 = 0;
    }
    if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar17 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x6e9,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
      if (!bVar9) goto LAB_00d97b76;
      *puVar17 = 0;
    }
    pRVar5 = (this->singletonInstance).ptr;
    if (pRVar5 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
LAB_00d975fb:
      descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)CONCAT71(descriptor._1_7_,0xd);
    }
    else {
      if ((DynamicObject *)(pRVar5->super_RecyclerWeakReferenceBase).strongRef != instance) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar17 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x6ec,
                                    "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                    ,
                                    "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                   );
        if (!bVar9) goto LAB_00d97b76;
        *puVar17 = 0;
        goto LAB_00d975fb;
      }
      descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)CONCAT71(descriptor._1_7_,0xd);
      if (0xf < (uint)propertyId) {
        BVar14 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if ((((PropertyOperationFlags)propertyRecord & PropertyOperation_NonFixedValue) ==
             PropertyOperation_None) && (BVar14 != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar17 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x6f1,
                                      "(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0)"
                                      ,
                                      "!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0"
                                     );
          if (!bVar9) goto LAB_00d97b76;
          *puVar17 = 0;
LAB_00d97b3d:
          bVar9 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixAccessorPropsPhase);
          bVar11 = !bVar9 << 5 | 0xd;
        }
        else {
          bVar11 = 0xd;
          if (((PropertyOperationFlags)propertyRecord & PropertyOperation_NonFixedValue) ==
              PropertyOperation_None) goto LAB_00d97b3d;
        }
        descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                     CONCAT71(descriptor._1_7_,bVar11);
        if ((byte)((byte)propertyRecord._4_4_ | (byte)local_74) == 1) {
          descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                       (CONCAT71(descriptor._1_7_,bVar11) | 0x10);
        }
      }
    }
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)(this->propertyMap).ptr,&local_70,
               (DictionaryPropertyDescriptor<unsigned_short> *)&descriptor);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                       ((DictionaryPropertyDescriptor<unsigned_short> *)&descriptor);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,local_60);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                       ((DictionaryPropertyDescriptor<unsigned_short> *)&descriptor);
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar12,local_50);
    pTVar2 = &local_58->typesWithOnlyWritablePropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_88);
    local_88 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_88);
    pPVar8 = local_70;
    pPVar7 = local_88;
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    pSVar4 = local_80;
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      PVar16 = DynamicTypeHandler::TMapKey_GetPropertyId(local_80,pPVar8);
      ScriptContext::InvalidateStoreFieldCaches(pSVar4,PVar16);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar7);
    }
    pTVar25 = &local_58->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_88);
    local_88 = pTVar25;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_88);
    pPVar7 = local_88;
    bVar9 = NoSpecialPropertyCache::IsSpecialProperty(local_70);
    if ((bVar9) &&
       (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
       ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar7);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,local_34,(Var)0x0,SideEffects_Any);
    uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                       ((DictionaryPropertyDescriptor<unsigned_short> *)&descriptor);
    pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
    if (pvVar20 != (Var)0x0) {
      uVar12 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                         ((DictionaryPropertyDescriptor<unsigned_short> *)&descriptor);
      pvVar20 = DynamicObject::GetSlot(instance,(uint)uVar12);
      if (pvVar20 != (Var)0x0) {
        return 1;
      }
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    error = 
    "(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr)"
    ;
    message = 
    "instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr"
    ;
    lineNumber = 0x708;
  }
  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                              ,lineNumber,error,message);
  if (bVar9) {
    *puVar17 = 0;
    return 1;
  }
LAB_00d97b76:
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        Assert(instance);
        JavascriptLibrary* library = instance->GetLibrary();
        ScriptContext* scriptContext = instance->GetScriptContext();

        Assert(this->VerifyIsExtensible(scriptContext, false) || this->HasProperty(instance, propertyId)
            || JavascriptFunction::IsBuiltinProperty(instance, propertyId));

        // We could potentially need 2 new slots to hold getter/setter, try pre-reserve
        if (this->GetSlotCapacity() - 2 < nextPropertyIndex)
        {
            if (this->GetSlotCapacity() > MaxPropertyIndexSize - 2)
            {
                return ConvertToBigDictionaryTypeHandler(instance)
                    ->SetAccessors(instance, propertyId, getter, setter, flags);
            }

            this->EnsureSlotCapacity(instance, 2);
        }

        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->GetFlags() & IsPrototypeFlag)
        {
            scriptContext->InvalidateProtoCaches(propertyId);
        }

        bool isGetterSet = true;
        bool isSetterSet = true;
        if (!getter || getter == library->GetDefaultAccessorFunction())
        {
            isGetterSet = false;
        }
        if (!setter || setter == library->GetDefaultAccessorFunction())
        {
            isSetterSet = false;
        }

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = PropertyDynamicTypeDefaults;
                }
            }

            if (!descriptor->GetIsAccessor())
            {
                // New getter/setter, make sure both values are not null and set to the slots
                getter = CanonicalizeAccessor(getter, library);
                setter = CanonicalizeAccessor(setter, library);
            }

            // conversion from data-property to accessor property
            if (descriptor->ConvertToGetterSetter(nextPropertyIndex))
            {
                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry
            }

            // DictionaryTypeHandlers are not supposed to be shared.
            Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

            // Although we don't actually have CreateTypeForNewScObject on DictionaryTypeHandler, we could potentially
            // transition to a DictionaryTypeHandler with some properties uninitialized.
            if (!descriptor->GetIsInitialized())
            {
                descriptor->SetIsInitialized(true);
                if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
                {
                    // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                    Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);
                    descriptor->SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
                }
                if (!isGetterSet || !isSetterSet)
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(true);
                }
            }
            else if (descriptor->GetIsOnlyOneAccessorInitialized())
            {
                // Only one of getter/setter was initialized, allow the isFixed to stay if we are defining the other one.
                Var oldGetter = GetSlot(instance, descriptor->GetGetterPropertyIndex());
                Var oldSetter = GetSlot(instance, descriptor->GetSetterPropertyIndex());

                if (((getter == oldGetter || !isGetterSet) && oldSetter == library->GetDefaultAccessorFunction()) ||
                    ((setter == oldSetter || !isSetterSet) && oldGetter == library->GetDefaultAccessorFunction()))
                {
                    descriptor->SetIsOnlyOneAccessorInitialized(false);
                }
                else
                {
                    InvalidateFixedField(instance, propertyId, descriptor);
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif

            // don't overwrite an existing accessor with null
            if (getter != nullptr)
            {
                getter = CanonicalizeAccessor(getter, library);
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), getter);
            }
            if (setter != nullptr)
            {
                setter = CanonicalizeAccessor(setter, library);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), setter);
            }
            instance->ChangeType();
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

            SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

            // Let's make sure we always have a getter and a setter
            Assert(instance->GetSlot(descriptor->GetGetterPropertyIndex()) != nullptr && instance->GetSlot(descriptor->GetSetterPropertyIndex()) != nullptr);

            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemAccessors(instance, propertyRecord->GetNumericValue(), getter, setter);
        }

        getter = CanonicalizeAccessor(getter, library);
        setter = CanonicalizeAccessor(setter, library);
        T getterIndex = ::Math::PostInc(nextPropertyIndex);
        T setterIndex = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(getterIndex, setterIndex);
        AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved 2 at entry

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
        newDescriptor.SetIsInitialized(true);
        if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId))
        {
            // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
            Assert(!instance->IsExternal() || (flags & PropertyOperation_NonFixedValue) != 0);

            // Even if one (or both?) accessors are the default functions obtained through canonicalization,
            // they are still legitimate functions, so it's ok to mark the whole property as fixed.
            newDescriptor.SetIsFixed((flags & PropertyOperation_NonFixedValue) == 0 && ShouldFixAccessorProperties());
            if (!isGetterSet || !isSetterSet)
            {
                newDescriptor.SetIsOnlyOneAccessorInitialized(true);
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        SetSlotUnchecked(instance, newDescriptor.GetGetterPropertyIndex(), getter);
        SetSlotUnchecked(instance, newDescriptor.GetSetterPropertyIndex(), setter);

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, PropertyNone, propertyRecord, scriptContext);

        SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);

        // Let's make sure we always have a getter and a setter
        Assert(instance->GetSlot(newDescriptor.GetGetterPropertyIndex()) != nullptr && instance->GetSlot(newDescriptor.GetSetterPropertyIndex()) != nullptr);

        return true;
    }